

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O3

Promise<void> __thiscall capnp::ClientHook::whenResolved(ClientHook *this)

{
  PromiseNode *pPVar1;
  TransformPromiseNodeBase *this_00;
  ImmediatePromiseNode<kj::_::Void> *pIVar2;
  ImmediatePromiseNode<kj::_::Void> *extraout_RDX;
  ImmediatePromiseNode<kj::_::Void> *extraout_RDX_00;
  kj kVar3;
  long *in_RSI;
  Own<kj::_::ChainPromiseNode> OVar4;
  Own<kj::_::ImmediatePromiseNode<kj::_::Void>_> OVar5;
  Promise<void> PVar6;
  Own<kj::_::PromiseNode> local_60;
  kj local_50;
  Own<kj::_::PromiseNode> local_48;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  PromiseNode *pPStack_28;
  
  (**(code **)(*in_RSI + 0x18))(&local_38);
  kVar3 = local_38._0_1_;
  local_50 = local_38._0_1_;
  if (local_38._0_1_ == (kj)0x1) {
    local_48.disposer = (Disposer *)CONCAT44(uStack_2c,uStack_30);
    local_48.ptr = pPStack_28;
    this_00 = (TransformPromiseNodeBase *)operator_new(0x28);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_48,
               kj::_::
               TransformPromiseNode<kj::Promise<void>,_kj::Own<capnp::ClientHook>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability.c++:93:26),_kj::_::PropagateException>
               ::anon_class_1_0_00000001_for_func::operator());
    (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0037a218;
    local_60.disposer =
         (Disposer *)
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,kj::Own<capnp::ClientHook>,capnp::ClientHook::whenResolved()::$_0,kj::_::PropagateException>>
          ::instance;
    local_60.ptr = (PromiseNode *)this_00;
    OVar4 = kj::heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>((kj *)&local_38,&local_60)
    ;
    pPVar1 = local_60.ptr;
    pIVar2 = (ImmediatePromiseNode<kj::_::Void> *)OVar4.ptr;
    *(undefined4 *)&this->_vptr_ClientHook = local_38;
    *(undefined4 *)((long)&this->_vptr_ClientHook + 4) = uStack_34;
    *(undefined4 *)&this[1]._vptr_ClientHook = uStack_30;
    *(undefined4 *)((long)&this[1]._vptr_ClientHook + 4) = uStack_2c;
    kVar3 = local_50;
    if ((TransformPromiseNodeBase *)local_60.ptr != (TransformPromiseNodeBase *)0x0) {
      local_60.ptr = (PromiseNode *)0x0;
      (**(local_60.disposer)->_vptr_Disposer)
                (local_60.disposer,
                 ((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                 (long)&((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode);
      pIVar2 = extraout_RDX;
      kVar3 = local_50;
    }
  }
  else {
    OVar5 = kj::heap<kj::_::ImmediatePromiseNode<kj::_::Void>,kj::_::Void>((Void *)&local_38);
    pIVar2 = OVar5.ptr;
    *(undefined4 *)&this->_vptr_ClientHook = local_38;
    *(undefined4 *)((long)&this->_vptr_ClientHook + 4) = uStack_34;
    *(undefined4 *)&this[1]._vptr_ClientHook = uStack_30;
    *(undefined4 *)((long)&this[1]._vptr_ClientHook + 4) = uStack_2c;
  }
  pPVar1 = local_48.ptr;
  if ((((byte)kVar3 & 1) != 0) && (local_48.ptr != (PromiseNode *)0x0)) {
    local_48.ptr = (PromiseNode *)0x0;
    (**(local_48.disposer)->_vptr_Disposer)
              (local_48.disposer,pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode);
    pIVar2 = extraout_RDX_00;
  }
  PVar6.super_PromiseBase.node.ptr = (PromiseNode *)pIVar2;
  PVar6.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar6.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> ClientHook::whenResolved() {
  KJ_IF_MAYBE(promise, whenMoreResolved()) {
    return promise->then([](kj::Own<ClientHook>&& resolution) {
      return resolution->whenResolved();
    });
  } else {
    return kj::READY_NOW;
  }